

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O2

bool __thiscall ParsedH265TrackData::spsppsExists(ParsedH265TrackData *this,uint8_t *buff,int size)

{
  uint32_t uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  uint32_t *cur32;
  uint32_t *puVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  bVar2 = (this->super_ParsedH264TrackData).m_nalSize;
  bVar7 = 0;
  bVar8 = 0;
  bVar6 = 0;
  for (puVar5 = (uint32_t *)buff; uVar4 = (ulong)bVar2, puVar5 < buff + ((long)size - uVar4);
      puVar5 = (uint32_t *)((long)puVar5 + (ulong)(uVar1 + bVar2))) {
    if (bVar2 == 4) {
      uVar1 = my_ntohl(*puVar5);
      bVar2 = (this->super_ParsedH264TrackData).m_nalSize;
      uVar4 = (ulong)bVar2;
    }
    else {
      uVar1 = (uint)*(byte *)((long)puVar5 + 2) |
              (uint)*(byte *)((long)puVar5 + 1) << 8 | (uint)(byte)*puVar5 << 0x10;
    }
    bVar3 = *(byte *)((long)puVar5 + uVar4) >> 1 & 0x3f;
    if (bVar3 == 0x20) {
      bVar6 = 1;
    }
    else if (bVar3 == 0x22) {
      bVar8 = 1;
    }
    else if (bVar3 == 0x21) {
      bVar7 = 1;
    }
  }
  return (bool)(bVar6 & bVar7 & bVar8);
}

Assistant:

bool ParsedH265TrackData::spsppsExists(uint8_t* buff, const int size)
{
    uint8_t* curPos = buff;
    const uint8_t* end = buff + size;
    bool vpsFound = false;
    bool spsFound = false;
    bool ppsFound = false;
    while (curPos < end - m_nalSize)
    {
        uint32_t elSize;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        const auto nalUnitType = static_cast<HevcUnit::NalType>((curPos[m_nalSize] >> 1) & 0x3f);
        if (nalUnitType == HevcUnit::NalType::VPS)
            vpsFound = true;
        else if (nalUnitType == HevcUnit::NalType::SPS)
            spsFound = true;
        else if (nalUnitType == HevcUnit::NalType::PPS)
            ppsFound = true;
        curPos += elSize + m_nalSize;
    }
    return vpsFound && spsFound && ppsFound;
}